

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

PtrTokenOrSyntax * __thiscall
slang::syntax::UnconditionalBranchDirectiveSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,UnconditionalBranchDirectiveSyntax *this,
          size_t index)

{
  if (this == (UnconditionalBranchDirectiveSyntax *)0x1) {
    return __return_storage_ptr__ + 3;
  }
  if (this == (UnconditionalBranchDirectiveSyntax *)0x0) {
    return (PtrTokenOrSyntax *)
           ((long)&__return_storage_ptr__[1].
                   super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
           + 8);
  }
  return (PtrTokenOrSyntax *)0x0;
}

Assistant:

PtrTokenOrSyntax UnconditionalBranchDirectiveSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &directive;
        case 1: return &disabledTokens;
        default: return nullptr;
    }
}